

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Gia_ManNameMapVerify
               (Gia_Man_t *p,Gia_Man_t *p1,Gia_Man_t *p2,Vec_Int_t *vMap1,Vec_Int_t *vMap2,int *pMap
               )

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint i;
  uint uVar4;
  int Lit;
  int Lit_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar9;
  int iLitLut;
  int iLitAig;
  int fCompl;
  int iObj;
  Gia_Obj_t *pObjLut;
  Gia_Obj_t *pObjAig;
  int nSize;
  int iObj2;
  int iObj1;
  int iLut;
  int *pMap_local;
  Vec_Int_t *vMap2_local;
  Vec_Int_t *vMap1_local;
  Gia_Man_t *p2_local;
  Gia_Man_t *p1_local;
  Gia_Man_t *p_local;
  
  iVar3 = Vec_IntSize(vMap2);
  Gia_ManSetPhase(p1);
  Gia_ManSetPhase(p2);
  for (iObj2 = 0; iObj2 < iVar3; iObj2 = iObj2 + 1) {
    if (-1 < pMap[iObj2]) {
      i = Abc_Lit2Var(pMap[iObj2]);
      uVar4 = Abc_LitIsCompl(pMap[iObj2]);
      Lit = Vec_IntEntry(vMap1,i);
      Lit_00 = Vec_IntEntry(vMap2,iObj2);
      iVar5 = Abc_Lit2Var(Lit);
      pObj = Gia_ManObj(p1,iVar5);
      iVar5 = Gia_ObjIsCo(pObj);
      if ((iVar5 == 0) && (pObj->Value != 0xffffffff)) {
        iVar5 = Abc_Lit2Var(Lit_00);
        pGVar9 = Gia_ManObj(p2,iVar5);
        if (pGVar9->Value != 0xffffffff) {
          iVar5 = Abc_Lit2Var(pObj->Value);
          iVar5 = Gia_ObjReprSelf(p,iVar5);
          iVar6 = Abc_Lit2Var(pGVar9->Value);
          iVar6 = Gia_ObjReprSelf(p,iVar6);
          if (iVar5 != iVar6) {
            printf("Found functional mismatch for LutId %d and AigId %d.\n",(ulong)(uint)iObj2,
                   (ulong)i);
          }
          uVar1 = *(undefined8 *)pGVar9;
          uVar7 = Abc_LitIsCompl(Lit_00);
          uVar2 = *(undefined8 *)pObj;
          uVar8 = Abc_LitIsCompl(Lit);
          if (((uint)((ulong)uVar1 >> 0x3f) ^ uVar7) !=
              ((uint)((ulong)uVar2 >> 0x3f) ^ uVar8 ^ uVar4)) {
            printf("Found phase mismatch for LutId %d and AigId %d.\n",(ulong)(uint)iObj2,(ulong)i);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManNameMapVerify( Gia_Man_t * p, Gia_Man_t * p1, Gia_Man_t * p2, Vec_Int_t * vMap1, Vec_Int_t * vMap2, int * pMap )
{
    int iLut, iObj1, iObj2, nSize = Vec_IntSize(vMap2);
    Gia_Obj_t * pObjAig, * pObjLut;
    Gia_ManSetPhase( p1 );
    Gia_ManSetPhase( p2 );
    for ( iLut = 0; iLut < nSize; iLut++ )
        if ( pMap[iLut] >= 0 )
        {
            int iObj   = Abc_Lit2Var( pMap[iLut] );
            int fCompl = Abc_LitIsCompl( pMap[iLut] );
            int iLitAig = Vec_IntEntry( vMap1, iObj );
            int iLitLut = Vec_IntEntry( vMap2, iLut );
            pObjAig = Gia_ManObj( p1, Abc_Lit2Var(iLitAig) );
            if ( Gia_ObjIsCo(pObjAig) )
                continue;
            if ( ~pObjAig->Value == 0 )
                continue;
            pObjLut = Gia_ManObj( p2, Abc_Lit2Var(iLitLut) );
            if ( ~pObjLut->Value == 0 )
                continue;
            iObj1 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjAig->Value));
            iObj2 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjLut->Value));
            if ( iObj1 != iObj2 )
                printf( "Found functional mismatch for LutId %d and AigId %d.\n", iLut, iObj );
            if ( (pObjLut->fPhase ^ Abc_LitIsCompl(iLitLut)) != (pObjAig->fPhase ^ Abc_LitIsCompl(iLitAig) ^ fCompl) )
                printf( "Found phase mismatch for LutId %d and AigId %d.\n", iLut, iObj );
        }
}